

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

void __thiscall Engine::Engine(Engine *this)

{
  this->variables = (Variable **)0x0;
  this->variablesCount = 0;
  this->localFunctions = (LocalFunction **)0x0;
  this->localFunctionsCount = 0;
  this->currentScript = (ScriptBlock *)0x0;
  (this->callStack).super__Vector_base<CallArgs_*,_std::allocator<CallArgs_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->callStack).super__Vector_base<CallArgs_*,_std::allocator<CallArgs_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->callStack).super__Vector_base<CallArgs_*,_std::allocator<CallArgs_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->callStack).super__Vector_base<CallArgs_*,_std::allocator<CallArgs_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

Engine::Engine() {
	this->variables = nullptr;
	this->variablesCount = 0;
	this->localFunctions = nullptr;
	this->localFunctionsCount = 0;
	this->currentScript = nullptr;
	this->callStackPointer = 0;
}